

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

EndpointDeclaration * __thiscall
soul::PoolAllocator::allocate<soul::AST::EndpointDeclaration,soul::AST::Context,bool&>
          (PoolAllocator *this,Context *args,bool *args_1)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_31;
  EndpointDeclaration *local_30;
  EndpointDeclaration *newObject;
  PoolItem *newItem;
  bool *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (bool *)args;
  args_local = (Context *)this;
  newObject = (EndpointDeclaration *)allocateSpaceForObject(this,0x78);
  this_00 = &(newObject->super_ASTObject).context;
  AST::EndpointDeclaration::EndpointDeclaration
            ((EndpointDeclaration *)this_00,(Context *)args_local_1,(bool)((byte)newItem->size & 1))
  ;
  local_30 = (EndpointDeclaration *)this_00;
  pDVar1 = allocate(soul::AST::Context&&,bool&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(&local_31);
  *(DestructorFn **)&(newObject->super_ASTObject).objectType = pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }